

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_check_list(lys_module *module,lys_node_list *list,lys_node **child,int options,
                   unres_schema *unres)

{
  int iVar1;
  bool bVar2;
  lys_node_list *local_40;
  lys_node *node;
  unres_schema *unres_local;
  int options_local;
  lys_node **child_local;
  lys_node_list *list_local;
  lys_module *module_local;
  
  iVar1 = yang_check_typedef(module,(lys_node *)list,unres);
  if ((iVar1 == 0) &&
     (iVar1 = yang_check_iffeatures(module,(void *)0x0,list,LIST_KEYWORD,unres), iVar1 == 0)) {
    local_40 = list;
    if ((list->flags & 2) != 0) {
      list->flags = list->flags & 0x7f;
    }
    while( true ) {
      bVar2 = false;
      if (local_40 != (lys_node_list *)0x0) {
        bVar2 = (local_40->nodetype & (LYS_EXT|LYS_AUGMENT|LYS_GROUPING)) == LYS_UNKNOWN;
      }
      if (!bVar2) break;
      local_40 = (lys_node_list *)local_40->parent;
    }
    if (((local_40 == (lys_node_list *)0x0) && ((list->flags & 1) != 0)) &&
       (list->keys == (lys_node_leaf **)0x0)) {
      ly_vlog(module->ctx,LYE_MISSCHILDSTMT,LY_VLOG_LYS,list,"key","list");
    }
    else {
      iVar1 = yang_check_nodes(module,(lys_node *)list,*child,options,unres);
      if (iVar1 == 0) {
        *child = (lys_node *)0x0;
        if ((((list->keys == (lys_node_leaf **)0x0) ||
             (iVar1 = yang_read_key(module,list,unres), iVar1 == 0)) &&
            ((iVar1 = yang_read_unique(module,list,unres), iVar1 == 0 &&
             ((list->when == (lys_when *)0x0 ||
              (iVar1 = yang_check_ext_instance
                                 (module,&list->when->ext,(uint)list->when->ext_size,list->when,
                                  unres), iVar1 == 0)))))) &&
           (iVar1 = yang_check_must(module,list->must,(uint)list->must_size,unres), iVar1 == 0)) {
          if ((((module->ctx->models).flags & 2U) != 0) ||
             ((list->when == (lys_when *)0x0 && (list->must_size == '\0')))) {
            return 0;
          }
          if ((options & 4U) == 0) {
            iVar1 = unres_schema_add_node(module,unres,list,UNRES_XPATH,(lys_node *)0x0);
            if (iVar1 != -1) {
              return 0;
            }
          }
          else {
            iVar1 = lyxp_node_check_syntax((lys_node *)list);
            if (iVar1 == 0) {
              return 0;
            }
          }
        }
      }
      else {
        *child = (lys_node *)0x0;
      }
    }
  }
  return 1;
}

Assistant:

static int
yang_check_list(struct lys_module *module, struct lys_node_list *list, struct lys_node **child,
                int options, struct unres_schema *unres)
{
    struct lys_node *node;

    if (yang_check_typedef(module, (struct lys_node *)list, unres)) {
        goto error;
    }

    if (yang_check_iffeatures(module, NULL, list, LIST_KEYWORD, unres)) {
        goto error;
    }

    if (list->flags & LYS_CONFIG_R) {
        /* RFC 6020, 7.7.5 - ignore ordering when the list represents state data
         * ignore oredering MASK - 0x7F
         */
        list->flags &= 0x7F;
    }
    /* check - if list is configuration, key statement is mandatory
     * (but only if we are not in a grouping or augment, then the check is deferred) */
    for (node = (struct lys_node *)list; node && !(node->nodetype & (LYS_GROUPING | LYS_AUGMENT | LYS_EXT)); node = node->parent);
    if (!node && (list->flags & LYS_CONFIG_W) && !list->keys) {
        LOGVAL(module->ctx, LYE_MISSCHILDSTMT, LY_VLOG_LYS, list, "key", "list");
        goto error;
    }

    if (yang_check_nodes(module, (struct lys_node *)list, *child, options, unres)) {
        *child = NULL;
        goto error;
    }
    *child = NULL;

    if (list->keys && yang_read_key(module, list, unres)) {
        goto error;
    }

    if (yang_read_unique(module, list, unres)) {
        goto error;
    }

    if (list->when && yang_check_ext_instance(module, &list->when->ext, list->when->ext_size, list->when, unres)) {
        goto error;
    }
    if (yang_check_must(module, list->must, list->must_size, unres)) {
        goto error;
    }

    /* check XPath dependencies */
    if (!(module->ctx->models.flags & LY_CTX_TRUSTED) && (list->when || list->must_size)) {
        if (options & LYS_PARSE_OPT_INGRP) {
            if (lyxp_node_check_syntax((struct lys_node *)list)) {
                goto error;
            }
        } else {
            if (unres_schema_add_node(module, unres, list, UNRES_XPATH, NULL) == -1) {
                goto error;
            }
        }
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}